

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

xmlNodePtr getNext(xmlNodePtr cur,char *xpath)

{
  long lVar1;
  int *piVar2;
  xmlXPathCompExprPtr comp;
  xmlXPathObjectPtr res;
  xmlNodePtr ret;
  char *xpath_local;
  xmlNodePtr cur_local;
  
  res = (xmlXPathObjectPtr)0x0;
  if (((cur == (xmlNodePtr)0x0) || (cur->doc == (_xmlDoc *)0x0)) || (xpath == (char *)0x0)) {
    cur_local = (xmlNodePtr)0x0;
  }
  else {
    ctxtXPath->doc = cur->doc;
    ctxtXPath->node = cur;
    lVar1 = xmlXPathCompile(xpath);
    if (lVar1 == 0) {
      fprintf(_stderr,"Failed to compile %s\n",xpath);
      cur_local = (xmlNodePtr)0x0;
    }
    else {
      piVar2 = (int *)xmlXPathCompiledEval(lVar1,ctxtXPath);
      xmlXPathFreeCompExpr(lVar1);
      if (piVar2 == (int *)0x0) {
        cur_local = (xmlNodePtr)0x0;
      }
      else {
        if (((*piVar2 == 1) && (*(long *)(piVar2 + 2) != 0)) &&
           ((0 < **(int **)(piVar2 + 2) && (*(long *)(*(long *)(piVar2 + 2) + 8) != 0)))) {
          res = (xmlXPathObjectPtr)**(undefined8 **)(*(long *)(piVar2 + 2) + 8);
        }
        xmlXPathFreeObject(piVar2);
        cur_local = (xmlNodePtr)res;
      }
    }
  }
  return cur_local;
}

Assistant:

static xmlNodePtr
getNext(xmlNodePtr cur, const char *xpath) {
    xmlNodePtr ret = NULL;
    xmlXPathObjectPtr res;
    xmlXPathCompExprPtr comp;

    if ((cur == NULL)  || (cur->doc == NULL) || (xpath == NULL))
        return(NULL);
    ctxtXPath->doc = cur->doc;
    ctxtXPath->node = cur;
    comp = xmlXPathCompile(BAD_CAST xpath);
    if (comp == NULL) {
        fprintf(stderr, "Failed to compile %s\n", xpath);
	return(NULL);
    }
    res = xmlXPathCompiledEval(comp, ctxtXPath);
    xmlXPathFreeCompExpr(comp);
    if (res == NULL)
        return(NULL);
    if ((res->type == XPATH_NODESET) &&
        (res->nodesetval != NULL) &&
	(res->nodesetval->nodeNr > 0) &&
	(res->nodesetval->nodeTab != NULL))
	ret = res->nodesetval->nodeTab[0];
    xmlXPathFreeObject(res);
    return(ret);
}